

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_f75d13::TargetIncludeDirectoriesImpl::HandleMissingTarget
          (TargetIncludeDirectoriesImpl *this,string *name)

{
  cmMakefile *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  size_type local_40;
  pointer local_38;
  undefined8 local_30;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  
  this_00 = (this->super_cmTargetPropCommandBase).Makefile;
  local_58.first._M_len = 0x2f;
  local_58.first._M_str = "Cannot specify include directories for target \"";
  local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38 = (name->_M_dataplus)._M_p;
  local_40 = name->_M_string_length;
  local_30 = 0;
  local_28 = 0x25;
  local_20 = "\" which is not built by this project.";
  local_18 = 0;
  views._M_len = 3;
  views._M_array = &local_58;
  cmCatViews(&local_78,views);
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HandleMissingTarget(const std::string& name) override
  {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot specify include directories for target \"", name,
               "\" which is not built by this project."));
  }